

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsGFkSolve.cpp
# Opt level: O2

void __thiscall HighsGFkSolve::addNonzero(HighsGFkSolve *this,HighsInt row,HighsInt col,uint val)

{
  int *piVar1;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar3;
  ulong uVar4;
  int local_38;
  uint local_34;
  HighsInt local_30;
  HighsInt local_2c;
  
  piVar1 = (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_34 = val;
  local_30 = col;
  local_2c = row;
  if (piVar1 == (this->freeslots).c.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    uVar4 = (ulong)((long)(this->Avalue).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->Avalue).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->Avalue,&local_34);
    std::vector<int,_std::allocator<int>_>::push_back(&this->Arow,&local_2c);
    std::vector<int,_std::allocator<int>_>::push_back(&this->Acol,&local_30);
    local_38 = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Anext,&local_38);
    local_38 = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->Aprev,&local_38);
    local_38 = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->ARleft,&local_38);
    local_38 = -1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>(&this->ARright,&local_38);
    uVar2 = extraout_EDX_00;
    uVar3 = extraout_var_00;
  }
  else {
    uVar4 = (ulong)*piVar1;
    std::priority_queue<int,_std::vector<int,_std::allocator<int>_>,_std::greater<int>_>::pop
              (&this->freeslots);
    (this->Avalue).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[uVar4] = val;
    (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = row;
    (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = col;
    (this->Aprev).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar4] = -1;
    uVar2 = extraout_EDX;
    uVar3 = extraout_var;
  }
  link(this,(char *)(uVar4 & 0xffffffff),(char *)CONCAT44(uVar3,uVar2));
  return;
}

Assistant:

void HighsGFkSolve::addNonzero(HighsInt row, HighsInt col, unsigned int val) {
  assert(findNonzero(row, col) == -1);
  HighsInt pos;
  if (freeslots.empty()) {
    pos = Avalue.size();
    Avalue.push_back(val);
    Arow.push_back(row);
    Acol.push_back(col);
    Anext.push_back(-1);
    Aprev.push_back(-1);
    ARleft.push_back(-1);
    ARright.push_back(-1);
  } else {
    pos = freeslots.top();
    freeslots.pop();
    Avalue[pos] = val;
    Arow[pos] = row;
    Acol[pos] = col;
    Aprev[pos] = -1;
  }

  link(pos);
}